

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SentencePieceLearner.cc
# Opt level: O1

void __thiscall
onmt::SentencePieceLearner::ingest_token_impl(SentencePieceLearner *this,string *token)

{
  basic_ofstream<char,_std::char_traits<char>_> *pbVar1;
  basic_ofstream<char,_std::char_traits<char>_> *this_00;
  ostream *poVar2;
  char local_19;
  
  if ((this->_input_stream)._M_t.
      super___uniq_ptr_impl<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
      .super__Head_base<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_false>.
      _M_head_impl == (basic_ofstream<char,_std::char_traits<char>_> *)0x0) {
    this_00 = (basic_ofstream<char,_std::char_traits<char>_> *)operator_new(0x200);
    std::ofstream::ofstream(this_00,(string *)&this->_input_filename,_S_out);
    pbVar1 = (this->_input_stream)._M_t.
             super___uniq_ptr_impl<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
             .super__Head_base<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_false>.
             _M_head_impl;
    (this->_input_stream)._M_t.
    super___uniq_ptr_impl<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
    .super__Head_base<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_false>._M_head_impl
         = this_00;
    if (pbVar1 != (basic_ofstream<char,_std::char_traits<char>_> *)0x0) {
      (**(code **)(*(long *)pbVar1 + 8))();
    }
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)
                      (this->_input_stream)._M_t.
                      super___uniq_ptr_impl<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_false>
                      ._M_head_impl,(token->_M_dataplus)._M_p,token->_M_string_length);
  local_19 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_19,1);
  return;
}

Assistant:

void SentencePieceLearner::ingest_token_impl(const std::string& token)
  {
    if (!_input_stream)
      _input_stream.reset(new std::ofstream(_input_filename));
    *_input_stream << token << '\n';
  }